

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate1<std::complex<double>_>::apply
          (QGate1<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  complex<double> *pcVar1;
  undefined8 *puVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  complex<double> x2;
  complex<double> x1;
  SquareMatrix<std::complex<double>_> local_d8;
  SquareMatrix<std::complex<double>_> local_c8;
  double local_b8;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> _Stack_b0;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  SquareMatrix<std::complex<double>_> local_68;
  complex<double> local_58;
  complex<double> local_48;
  long local_38;
  
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  iVar8 = (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  uVar9 = iVar8 + offset;
  if (nbQubits <= (int)uVar9) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_c8,this);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&local_c8);
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<std::complex<double>_>::operator*=(matrix,&local_c8);
    }
    else {
      local_88 = CONCAT44(local_88._4_4_,~uVar9 + nbQubits);
      lVar15 = matrix->size_;
      if (0 < lVar15) {
        local_70 = (ulong)(1 << ((byte)(~uVar9 + nbQubits) & 0x1f));
        uVar13 = 1 << ((byte)uVar9 & 0x1f);
        local_90 = 1;
        if (1 < (long)local_70) {
          local_90 = local_70;
        }
        local_a0 = local_70 * 2;
        if ((int)uVar13 < 2) {
          uVar13 = 1;
        }
        local_98 = (ulong)uVar13;
        lVar16 = 0;
        do {
          if (uVar9 != 0x1f) {
            uVar12 = 0;
            uVar10 = 0;
            local_38 = lVar16;
            do {
              uVar14 = local_90;
              local_80 = uVar10;
              local_78 = uVar12;
              if ((int)local_88 != 0x1f) {
                do {
                  lVar15 = local_70 + uVar12;
                  pcVar3 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  pcVar1 = pcVar3 + matrix->size_ * uVar12 + lVar16;
                  local_48._M_value._0_8_ = *(undefined8 *)pcVar1->_M_value;
                  local_48._M_value._8_8_ = *(undefined8 *)(pcVar1->_M_value + 8);
                  pcVar3 = pcVar3 + matrix->size_ * lVar15 + lVar16;
                  local_58._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
                  local_58._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
                  local_d8.size_ =
                       *(size_type_conflict *)
                        local_c8.data_._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  local_d8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                         *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              *)((long)local_c8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + 8))->_M_t;
                  std::complex<double>::operator*=((complex<double> *)&local_d8,&local_48);
                  local_b8 = (double)local_d8.size_;
                  _Stack_b0._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       local_d8.data_._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  local_d8.size_ =
                       *(size_type_conflict *)
                        ((complex<double> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                        0x10))->_M_value;
                  local_d8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                         *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              *)((long)((complex<double> *)
                                       ((long)local_c8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                              .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                              _M_head_impl + 0x10))->_M_value + 8))->_M_t;
                  std::complex<double>::operator*=((complex<double> *)&local_d8,&local_58);
                  auVar4._8_4_ = SUB84((double)_Stack_b0._M_t.
                                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                               .super__Head_base<0UL,_std::complex<double>_*,_false>
                                               ._M_head_impl +
                                       (double)local_d8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                               .super__Head_base<0UL,_std::complex<double>_*,_false>
                                               ._M_head_impl,0);
                  auVar4._0_8_ = local_b8 + (double)local_d8.size_;
                  auVar4._12_4_ =
                       (int)((ulong)((double)_Stack_b0._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl +
                                    (double)local_d8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl) >> 0x20);
                  *(undefined1 (*) [16])
                   (matrix->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                   [matrix->size_ * uVar12 + lVar16]._M_value = auVar4;
                  pcVar1 = (complex<double> *)
                           ((long)local_c8.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                           + local_c8.size_ * 0x10);
                  local_d8.size_ = *(size_type_conflict *)pcVar1->_M_value;
                  local_d8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                         *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              *)((long)pcVar1->_M_value + 8))->_M_t;
                  std::complex<double>::operator*=((complex<double> *)&local_d8,&local_48);
                  local_b8 = (double)local_d8.size_;
                  _Stack_b0._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       local_d8.data_._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  local_d8.size_ =
                       *(size_type_conflict *)
                        ((complex<double> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                        0x10))[local_c8.size_]._M_value;
                  local_d8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                        )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                         ((long)((complex<double> *)
                                ((long)local_c8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + 0x10))[local_c8.size_]._M_value + 8))->
                         _M_head_impl;
                  std::complex<double>::operator*=((complex<double> *)&local_d8,&local_58);
                  auVar5._8_4_ = SUB84((double)_Stack_b0._M_t.
                                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                               .super__Head_base<0UL,_std::complex<double>_*,_false>
                                               ._M_head_impl +
                                       (double)local_d8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                               .super__Head_base<0UL,_std::complex<double>_*,_false>
                                               ._M_head_impl,0);
                  auVar5._0_8_ = local_b8 + (double)local_d8.size_;
                  auVar5._12_4_ =
                       (int)((ulong)((double)_Stack_b0._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl +
                                    (double)local_d8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl) >> 0x20);
                  *(undefined1 (*) [16])
                   (matrix->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                   [lVar15 * matrix->size_ + lVar16]._M_value = auVar5;
                  uVar12 = uVar12 + 1;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              uVar10 = local_80 + 1;
              uVar12 = local_78 + local_a0;
            } while (uVar10 != local_98);
            lVar15 = matrix->size_;
            lVar16 = local_38;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < lVar15);
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_68,&local_c8);
    dense::SquareMatrix<std::complex<double>_>::operator*=(&local_68,matrix);
    dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_d8,&local_68);
    dense::SquareMatrix<std::complex<double>_>::operator=(matrix,&local_d8);
    if ((_Head_base<0UL,_std::complex<double>_*,_false>)
        local_d8.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
      operator_delete__((void *)local_d8.data_._M_t.
                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
    }
    local_d8.data_._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
    if (local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      operator_delete__((void *)local_68.data_._M_t.
                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
    }
    local_68.data_._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  }
  else {
    local_80 = CONCAT44(local_80._4_4_,~uVar9 + nbQubits);
    lVar15 = matrix->size_;
    if (0 < lVar15) {
      lVar16 = (long)(1 << ((byte)(~uVar9 + nbQubits) & 0x1f));
      uVar13 = 1 << ((byte)uVar9 & 0x1f);
      local_88 = 1;
      if (1 < lVar16) {
        local_88 = lVar16;
      }
      if ((int)uVar13 < 2) {
        uVar13 = 1;
      }
      local_90 = (ulong)uVar13;
      local_98 = lVar16 << 5;
      lVar17 = 0;
      lVar11 = 0;
      do {
        if (uVar9 != 0x1f) {
          uVar12 = 0;
          uVar10 = 0;
          local_a0 = lVar11;
          do {
            lVar15 = local_88;
            local_78 = uVar10;
            local_70 = uVar12;
            if ((int)local_80 != 0x1f) {
              do {
                lVar11 = matrix->size_ * lVar17;
                pcVar1 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                puVar2 = (undefined8 *)(pcVar1->_M_value + uVar12 + lVar11);
                local_48._M_value._0_8_ = *puVar2;
                local_48._M_value._8_8_ = puVar2[1];
                puVar2 = (undefined8 *)(pcVar1[lVar16]._M_value + uVar12 + lVar11);
                local_58._M_value._0_8_ = *puVar2;
                local_58._M_value._8_8_ = puVar2[1];
                local_d8.size_ =
                     *(size_type_conflict *)
                      local_c8.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_d8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                       *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            *)((long)local_c8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl + 8))->_M_t;
                std::complex<double>::operator*=((complex<double> *)&local_d8,&local_48);
                local_b8 = (double)local_d8.size_;
                _Stack_b0._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     local_d8.data_._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_d8.size_ =
                     *(size_type_conflict *)
                      ((complex<double> *)
                      ((long)local_c8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                      local_c8.size_ * 0x10))->_M_value;
                local_d8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                       *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            *)((long)((complex<double> *)
                                     ((long)local_c8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + local_c8.size_ * 0x10))->_M_value + 8))->
                          _M_t;
                std::complex<double>::operator*=((complex<double> *)&local_d8,&local_58);
                auVar6._8_4_ = SUB84((double)_Stack_b0._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl +
                                     (double)local_d8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl,0);
                auVar6._0_8_ = local_b8 + (double)local_d8.size_;
                auVar6._12_4_ =
                     (int)((ulong)((double)_Stack_b0._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl +
                                  (double)local_d8.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl) >> 0x20);
                *(undefined1 (*) [16])
                 (((matrix->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value +
                 uVar12 + matrix->size_ * lVar17) = auVar6;
                local_d8.size_ =
                     *(size_type_conflict *)
                      ((complex<double> *)
                      ((long)local_c8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                      0x10))->_M_value;
                local_d8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                       *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            *)((long)local_c8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl + 0x18))->_M_t;
                std::complex<double>::operator*=((complex<double> *)&local_d8,&local_48);
                local_b8 = (double)local_d8.size_;
                _Stack_b0._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     local_d8.data_._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_d8.size_ =
                     *(size_type_conflict *)
                      ((complex<double> *)
                      ((long)local_c8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                      0x10))[local_c8.size_]._M_value;
                local_d8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                      )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                       ((long)((complex<double> *)
                              ((long)local_c8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl + 0x10))[local_c8.size_]._M_value + 8))->
                       _M_head_impl;
                std::complex<double>::operator*=((complex<double> *)&local_d8,&local_58);
                auVar7._8_4_ = SUB84((double)_Stack_b0._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl +
                                     (double)local_d8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl,0);
                auVar7._0_8_ = local_b8 + (double)local_d8.size_;
                auVar7._12_4_ =
                     (int)((ulong)((double)_Stack_b0._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl +
                                  (double)local_d8.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl) >> 0x20);
                *(undefined1 (*) [16])
                 ((matrix->data_)._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar16].
                  _M_value + uVar12 + matrix->size_ * lVar17) = auVar7;
                uVar12 = uVar12 + 0x10;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
            }
            uVar10 = local_78 + 1;
            uVar12 = local_70 + local_98;
          } while (uVar10 != local_90);
          lVar15 = matrix->size_;
          lVar11 = local_a0;
        }
        lVar11 = lVar11 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar11 < lVar15);
    }
  }
  if (local_c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }